

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform.h
# Opt level: O3

bool __thiscall senjo::ParamMatch(senjo *this,string *name,char **params)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  char *pcVar4;
  
  if ((((name == (string *)0x0) || (pcVar4 = *params, pcVar4 == (char *)0x0)) ||
      (iVar2 = strncmp(pcVar4,(char *)this,(size_t)name), iVar2 != 0)) ||
     ((pcVar4[(long)name] != '\0' && (iVar2 = isspace((int)pcVar4[(long)name]), iVar2 == 0)))) {
    bVar3 = false;
  }
  else {
    *params = pcVar4 + (long)name;
    cVar1 = pcVar4[(long)name];
    bVar3 = true;
    if (cVar1 != '\0') {
      pcVar4 = pcVar4 + (long)&name->_M_dataplus;
      do {
        pcVar4 = pcVar4 + 1;
        iVar2 = isspace((int)cVar1);
        if (iVar2 == 0) {
          return true;
        }
        *params = pcVar4;
        cVar1 = *pcVar4;
      } while (cVar1 != '\0');
    }
  }
  return bVar3;
}

Assistant:

static inline bool ParamMatch(const std::string& name, const char*& params)
{
  if (name.empty() || !params) {
    return false;
  }
  if (strncmp(params, name.c_str(), name.size()) ||
      (params[name.size()] && !isspace(params[name.size()])))
  {
    return false;
  }
  NextWord(params += name.size());
  return true;
}